

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O3

void __thiscall xray_re::xr_ini_file::ini_section::merge(ini_section *this,ini_section *section)

{
  pointer pcVar1;
  pointer ppiVar2;
  ini_item *piVar3;
  int iVar4;
  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  __position;
  value_type piVar5;
  ini_item *piVar6;
  pointer ppiVar7;
  ini_item_vec *this_00;
  ini_item *item;
  ini_item *local_50;
  ini_item_vec *local_48;
  pointer local_40;
  value_type local_38;
  
  this_00 = &this->items;
  if ((this->items).
      super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->items).
      super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
    ::reserve(this_00,(long)(section->items).
                            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(section->items).
                            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppiVar2 = (section->items).
              super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppiVar7 = (section->items).
                   super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppiVar7 != ppiVar2;
        ppiVar7 = ppiVar7 + 1) {
      piVar6 = (ini_item *)operator_new(0x40);
      piVar3 = *ppiVar7;
      (piVar6->name)._M_dataplus._M_p = (pointer)&(piVar6->name).field_2;
      pcVar1 = (piVar3->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)piVar6,pcVar1,pcVar1 + (piVar3->name)._M_string_length);
      (piVar6->value)._M_dataplus._M_p = (pointer)&(piVar6->value).field_2;
      pcVar1 = (piVar3->value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&piVar6->value,pcVar1,pcVar1 + (piVar3->value)._M_string_length);
      local_50 = piVar6;
      std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>::
      emplace_back<xray_re::xr_ini_file::ini_item*>
                ((vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>
                  *)this_00,&local_50);
    }
  }
  else {
    ppiVar7 = (section->items).
              super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (section->items).
               super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_48 = this_00;
    if (ppiVar7 != local_40) {
      do {
        local_50 = *ppiVar7;
        __position = std::
                     __lower_bound<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_item**,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>,xray_re::xr_ini_file::ini_item_const*,__gnu_cxx::__ops::_Iter_comp_val<xray_re::ptr_less<xray_re::xr_ini_file::ini_item>>>
                               ((this->items).
                                super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (this->items).
                                super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        piVar3 = local_50;
        if (__position._M_current ==
            (this->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00163592:
          piVar5 = (value_type)operator_new(0x40);
          (piVar5->name)._M_dataplus._M_p = (pointer)&(piVar5->name).field_2;
          pcVar1 = (piVar3->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)piVar5,pcVar1,pcVar1 + (piVar3->name)._M_string_length);
          (piVar5->value)._M_dataplus._M_p = (pointer)&(piVar5->value).field_2;
          pcVar1 = (piVar3->value)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&piVar5->value,pcVar1,pcVar1 + (piVar3->value)._M_string_length);
          local_38 = piVar5;
          std::
          vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
          ::_M_insert_rval(local_48,(const_iterator)__position._M_current,&local_38);
        }
        else {
          piVar6 = *__position._M_current;
          iVar4 = strcasecmp((piVar6->name)._M_dataplus._M_p,(local_50->name)._M_dataplus._M_p);
          if (iVar4 != 0) goto LAB_00163592;
          std::__cxx11::string::_M_assign((string *)&piVar6->value);
        }
        ppiVar7 = ppiVar7 + 1;
      } while (ppiVar7 != local_40);
    }
  }
  return;
}

Assistant:

void xr_ini_file::ini_section::merge(const ini_section* section)
{
	if (items.empty()) {
		items.reserve(section->size());
		for (ini_item_vec_cit it = section->begin(), last = section->end();
				it != last; ++it) {
			items.push_back(new ini_item(**it));
		}
	} else {
		// FIXME: do it O(max(M, N)) instead of O(M*log(N))
		for (ini_item_vec_cit it = section->begin(), last = section->end();
				it != last; ++it) {
			const ini_item* item = *it;
			ini_item_vec_it it1 = std::lower_bound(begin(), end(), item, ptr_less<ini_item>());
			if (it1 == end() || xr_stricmp((*it1)->name.c_str(), item->name.c_str()) != 0)
				items.insert(it1, new ini_item(*item));
			else
				(*it1)->value = item->value;
		}
	}
}